

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O2

void __thiscall
COLLADASaxFWL::MeshLoader::loadSourceElements
          (MeshLoader *this,MeshPrimitiveInputList *polyBaseElement)

{
  size_t sVar1;
  size_t n;
  size_t sVar2;
  
  sVar1 = (polyBaseElement->mInputArray).mCount;
  for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
    loadSourceElement(this,(polyBaseElement->mInputArray).mData[sVar2]);
  }
  return;
}

Assistant:

void MeshLoader::loadSourceElements ( const MeshPrimitiveInputList& polyBaseElement )
    {
        const InputSharedArray& inputArray = polyBaseElement.getInputArray ();
        size_t numInputElements = inputArray.getCount ();
        for ( size_t n=0; n<numInputElements; ++n )
        {
            // Get the input element and read the semantic.
            InputShared* input = inputArray [n];

            // Load the source element of the current input element into the framework mesh.
            loadSourceElement ( *input );
        }
    }